

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O1

void do_cmd_roll_stats(command *cmd)

{
  uint32_t *puVar1;
  int16_t *piVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  player *ppVar5;
  short sVar6;
  int16_t iVar7;
  uint32_t uVar8;
  char *pcVar9;
  int *piVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int *piVar15;
  wchar_t dice [15];
  int local_68 [18];
  
  save_roller_data(&prev);
  uVar11 = 0;
  iVar14 = 0;
  do {
    do {
      uVar8 = Rand_div((int)uVar11 + (int)((uVar11 & 0xffffffff) / 3) * -3 + 3);
      local_68[uVar11] = uVar8 + 1;
      iVar13 = iVar14 + uVar8;
      iVar14 = iVar13 + 1;
      uVar11 = uVar11 + 1;
    } while (uVar11 != 0xf);
    uVar11 = 0;
    iVar14 = 0;
  } while (8 < iVar13 - 0x23U);
  lVar12 = -5;
  piVar15 = stats;
  piVar10 = local_68 + 2;
  do {
    ppVar5 = player;
    sVar6 = (short)piVar10[-2] + (short)piVar10[-1] + (short)*piVar10 + 5;
    player->stat_cur[lVar12] = sVar6;
    wVar3 = ppVar5->class->c_skills[lVar12];
    wVar4 = ppVar5->race->r_skills[lVar12];
    ppVar5->stat_map[lVar12] = sVar6;
    ppVar5->stat_map[lVar12 + 5] = (short)lVar12 + 5;
    iVar7 = modify_stat_value((int)sVar6,wVar3 + wVar4);
    *piVar15 = (int)iVar7;
    ppVar5 = player;
    player->stat_birth[lVar12 + 5] = player->stat_cur[lVar12];
    piVar15 = piVar15 + 1;
    piVar10 = piVar10 + 3;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0);
  puVar1 = &ppVar5->upkeep->update;
  *puVar1 = *puVar1 | 5;
  update_stuff(ppVar5);
  ppVar5 = player;
  piVar2 = &player->msp;
  player->chp = player->mhp;
  ppVar5->csp = *piVar2;
  get_ahw(ppVar5);
  if (player->history != (char *)0x0) {
    string_free(player->history);
  }
  pcVar9 = get_history(player->race->history);
  player->history = pcVar9;
  event_signal(EVENT_GOLD);
  event_signal(EVENT_AC);
  event_signal(EVENT_HP);
  event_signal(EVENT_STATS);
  points_left = L'\0';
  points_spent[0] = 0;
  points_spent[1] = 0;
  points_spent[2] = 0;
  points_spent[3] = 0;
  points_spent[4] = 0;
  points_inc[0] = 0;
  points_inc[1] = 0;
  points_inc[2] = 0;
  points_inc[3] = 0;
  points_inc[4] = 0;
  event_signal_birthpoints(points_spent,points_inc,L'\0');
  rolled_stats = 1;
  return;
}

Assistant:

void do_cmd_roll_stats(struct command *cmd)
{
	int i;

	save_roller_data(&prev);

	/* Get a new character */
	get_stats(stats);

	/* Update stats with bonuses, etc. */
	get_bonuses();

	/* There's no real need to do this here, but it's tradition. */
	get_ahw(player);
	if (player->history)
		string_free(player->history);
	player->history = get_history(player->race->history);

	event_signal(EVENT_GOLD);
	event_signal(EVENT_AC);
	event_signal(EVENT_HP);
	event_signal(EVENT_STATS);

	/* Give the UI some dummy info about the points situation. */
	points_left = 0;
	for (i = 0; i < STAT_MAX; i++) {
		points_spent[i] = 0;
		points_inc[i] = 0;
	}

	event_signal_birthpoints(points_spent, points_inc, points_left);

	/* Lock out buying and selling of stats based on rolled stats. */
	rolled_stats = true;
}